

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O2

bool __thiscall
GmmLib::GmmResourceInfoCommon::IsMipRCCAligned(GmmResourceInfoCommon *this,uint8_t *MisAlignedLod)

{
  uint uVar1;
  uint uVar2;
  uint8_t lod;
  byte bVar3;
  
  bVar3 = 0;
  do {
    uVar1 = (*this->_vptr_GmmResourceInfoCommon[0x2a])(this);
    if ((uVar1 & 0xff) < (uint)bVar3) {
LAB_001add06:
      return (uVar1 & 0xff) < (uint)bVar3;
    }
    uVar2 = (*this->_vptr_GmmResourceInfoCommon[0x16])(this,(ulong)(uint)bVar3);
    if ((uVar2 & 0x1f) != 0) {
LAB_001add03:
      *MisAlignedLod = bVar3;
      goto LAB_001add06;
    }
    uVar2 = (*this->_vptr_GmmResourceInfoCommon[0x17])(this,(ulong)(uint)bVar3);
    if ((uVar2 & 3) != 0) goto LAB_001add03;
    bVar3 = bVar3 + 1;
  } while( true );
}

Assistant:

bool GMM_STDCALL GmmLib::GmmResourceInfoCommon::IsMipRCCAligned(uint8_t &MisAlignedLod)
{
    const uint8_t RCCCachelineWidth  = 32;
    const uint8_t RCCCachelineHeight = 4;

    for(uint8_t lod = 0; lod <= ((uint8_t)GetMaxLod()); lod++)
    {
        if(!(GFX_IS_ALIGNED(GetMipWidth(lod), RCCCachelineWidth) &&
             GFX_IS_ALIGNED(GetMipHeight(lod), RCCCachelineHeight)))
        {
            MisAlignedLod = lod;
            return false;
        }
    }
    return true;
}